

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io_context.cpp
# Opt level: O2

void __thiscall boozd::azzio::io_context::run(io_context *this)

{
  vector<int,std::allocator<int>> *this_00;
  long *plVar1;
  long lVar2;
  long lVar3;
  optional<int> read;
  duration<long,_std::ratio<1L,_1000L>_> local_30;
  
  if (((this->_pack_optional).
       super__Optional_base<std::tuple<boozd::azzio::stream_&,_std::vector<int,_std::allocator<int>_>_&>,_true,_false>
       ._M_payload.
       super__Optional_payload_base<std::tuple<boozd::azzio::stream_&,_std::vector<int,_std::allocator<int>_>_&>_>
       ._M_engaged == true) &&
     ((this->_handler_optional).
      super__Optional_base<std::function<void_(boozd::azzio::io_context::error_code)>,_false,_false>
      ._M_payload.
      super__Optional_payload<std::function<void_(boozd::azzio::io_context::error_code)>,_true,_false,_false>
      .super__Optional_payload_base<std::function<void_(boozd::azzio::io_context::error_code)>_>.
      _M_engaged == true)) {
    this_00 = *(vector<int,std::allocator<int>> **)
               &(this->_pack_optional).
                super__Optional_base<std::tuple<boozd::azzio::stream_&,_std::vector<int,_std::allocator<int>_>_&>,_true,_false>
                ._M_payload.
                super__Optional_payload_base<std::tuple<boozd::azzio::stream_&,_std::vector<int,_std::allocator<int>_>_&>_>
                ._M_payload._M_value.
                super__Tuple_impl<0UL,_boozd::azzio::stream_&,_std::vector<int,_std::allocator<int>_>_&>
                .super__Tuple_impl<1UL,_std::vector<int,_std::allocator<int>_>_&>;
    plVar1 = *(long **)((long)&(this->_pack_optional).
                               super__Optional_base<std::tuple<boozd::azzio::stream_&,_std::vector<int,_std::allocator<int>_>_&>,_true,_false>
                               ._M_payload.
                               super__Optional_payload_base<std::tuple<boozd::azzio::stream_&,_std::vector<int,_std::allocator<int>_>_&>_>
                               ._M_payload + 8);
    lVar2 = std::chrono::_V2::steady_clock::now();
    while( true ) {
      lVar3 = std::chrono::_V2::steady_clock::now();
      if (999999999 < lVar3 - lVar2) break;
      local_30.__r = (**(code **)(*plVar1 + 0x10))(plVar1);
      if (((ulong)local_30.__r >> 0x20 & 1) != 0) {
        std::vector<int,std::allocator<int>>::emplace_back<int&>(this_00,(int *)&local_30);
      }
      local_30.__r = 100;
      std::this_thread::sleep_for<long,std::ratio<1l,1000l>>(&local_30);
    }
    std::function<void_(boozd::azzio::io_context::error_code)>::operator()
              ((function<void_(boozd::azzio::io_context::error_code)> *)&this->_handler_optional,
               no_error);
  }
  return;
}

Assistant:

void io_context::run()
{
    if (_pack_optional && _handler_optional) {
        auto& [s, b] = *_pack_optional;
        using namespace std::chrono;
        auto start = steady_clock::now();
        while (duration_cast<milliseconds>(steady_clock::now() - start).count() < 1000) {
            if (auto read = s.read())
                b.emplace_back(*read);
            std::this_thread::sleep_for(milliseconds(100));
        }

        (*_handler_optional)(error_code::no_error);
    }
}